

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list)

{
  undefined8 *puVar1;
  void *pvVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  long lVar5;
  ulong uVar6;
  
  ppEVar3 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)ppEVar4 - (long)ppEVar3 >> 3;
  if (*(ulong *)(this + 0x10) < uVar6) {
    *(ulong *)(this + 0x10) = uVar6;
    pvVar2 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),(long)ppEVar4 - (long)ppEVar3,8);
    *(void **)this = pvVar2;
    ppEVar3 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppEVar3 != ppEVar4) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)ppEVar3 + lVar5);
      *(undefined8 *)(*(long *)this + lVar5) = *puVar1;
      lVar5 = lVar5 + 8;
    } while ((pointer)(puVar1 + 1) != ppEVar4);
  }
  *(ulong *)(this + 8) = uVar6;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }